

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O3

void __thiscall TPZString::SimplifyWhiteSpace(TPZString *this)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  
  if ((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fNElements ==
      0) {
    uVar1 = 0xffffffff;
  }
  else {
    sVar2 = strlen((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                   fStore);
    uVar1 = (int)sVar2 - 1;
    if (uVar1 == 0) {
      uVar3 = 0;
      goto LAB_00b05065;
    }
  }
  uVar8 = 0;
  uVar3 = 0;
  do {
    pcVar5 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
    ;
    cVar6 = pcVar5[uVar8];
    uVar4 = (uint)uVar3;
    if (cVar6 == ' ') {
      if (uVar8 != 0) {
        pcVar5[uVar3] = ' ';
        uVar4 = uVar4 + 1;
        pcVar5 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                 fStore;
      }
      uVar7 = uVar8 + 1;
      while (cVar6 = pcVar5[uVar7], cVar6 == ' ') {
        uVar7 = uVar8 + 2;
        uVar8 = uVar8 + 1;
      }
LAB_00b05049:
      pcVar5[uVar4] = cVar6;
      uVar7 = uVar4;
    }
    else {
      uVar7 = uVar8;
      if (uVar4 != uVar8) goto LAB_00b05049;
    }
    uVar3 = (ulong)(uVar7 + 1);
    uVar8 = uVar8 + 1;
  } while (uVar8 < uVar1);
LAB_00b05065:
  (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore[uVar3] =
       '\0';
  return;
}

Assistant:

void TPZString::SimplifyWhiteSpace()
{
	unsigned int i, newpos = 0;
	const unsigned int length = Length();
	char current = '0', next = '0';
	for (i = 0; i < length - 1; i++)
	{
		current = fStore[i];
		if (current == ' ')
		{
			if (i)
			{
				fStore[newpos] = ' ';
				newpos++;
			}
			next = fStore[i + 1];
			while (next == ' ')
			{
				i++;
				next = fStore[i + 1];
			}
			fStore[newpos] = next;
			newpos++;
		}
		else
		{
			if (newpos != i) fStore[newpos] = current;
			newpos++;
		}
	}
	fStore[newpos] = '\0';
}